

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::type_caster_generic::cast
                 (void *_src,return_value_policy policy,handle parent,type_info *tinfo,
                 _func_void_ptr_void_ptr *copy_constructor,_func_void_ptr_void_ptr *move_constructor
                 ,void *existing_holder)

{
  pointer pptVar1;
  char *__s1;
  PyObject *pPVar2;
  byte bVar3;
  int iVar4;
  internals *piVar5;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  instance *this;
  void *pvVar8;
  runtime_error *prVar9;
  long *plVar10;
  _func_void_ptr_void_ptr *p_Var11;
  long *plVar12;
  PyObject *tmp;
  undefined1 auVar13 [8];
  string *this_00;
  pointer pptVar14;
  anon_union_24_2_63b86169_for_instance_1 *paVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar16;
  void *src;
  string type_name;
  void *local_b8;
  undefined1 local_b0 [8];
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long lStack_90;
  _func_void_ptr_void_ptr *local_88;
  string local_80;
  handle local_60;
  _func_void_ptr_void_ptr *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (tinfo == (type_info *)0x0) {
    return (handle)(PyObject *)0x0;
  }
  local_b8 = _src;
  if (_src == (void *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    this_00 = &local_80;
    auVar13 = (undefined1  [8])&_Py_NoneStruct;
    goto LAB_0022319d;
  }
  local_88 = copy_constructor;
  local_60.m_ptr = parent.m_ptr;
  local_58 = move_constructor;
  piVar5 = get_internals();
  pVar16 = std::
           _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
           ::equal_range(&(piVar5->registered_instances)._M_h,&local_b8);
  for (_Var6._M_cur = (__node_type *)
                      pVar16.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
      (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
      _Var6._M_cur !=
      pVar16.second.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>.
      _M_cur.
      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>;
      _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt) {
    pvVar7 = all_type_info(*(PyTypeObject **)
                            (*(long *)((long)&((_Var6._M_cur)->
                                              super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                                              ._M_storage._M_storage + 8) + 8));
    pptVar1 = (pvVar7->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pptVar14 = (pvVar7->
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; pptVar14 != pptVar1;
        pptVar14 = pptVar14 + 1) {
      if (*pptVar14 != (type_info *)0x0) {
        __s1 = *(char **)((*pptVar14)->cpptype + 8);
        if ((__s1 == *(char **)(tinfo->cpptype + 8)) ||
           ((*__s1 != '*' && (iVar4 = strcmp(__s1,*(char **)(tinfo->cpptype + 8)), iVar4 == 0)))) {
          pPVar2 = *(PyObject **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                            ._M_storage._M_storage + 8);
          if (pPVar2 == (PyObject *)0x0) {
            return (handle)(PyObject *)0x0;
          }
          pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
          return (handle)pPVar2;
        }
      }
    }
  }
  this = (instance *)(*tinfo->type->tp_alloc)(tinfo->type,0);
  instance::allocate_layout(this);
  bVar3 = this->field_0x30;
  this->field_0x30 = bVar3 | 1;
  this->field_0x30 = bVar3 & 0xfe;
  local_b0 = (undefined1  [8])this;
  all_type_info((this->ob_base).ob_type);
  paVar15 = &this->field_1;
  if ((this->field_0x30 & 2) == 0) {
    paVar15 = (anon_union_24_2_63b86169_for_instance_1 *)(paVar15->nonsimple).values_and_holders;
  }
  switch(policy) {
  case automatic:
  case take_ownership:
    pvVar8 = local_b8;
    break;
  case automatic_reference:
  case reference:
    paVar15->simple_value_holder[0] = local_b8;
    bVar3 = this->field_0x30 & 0xfe;
    goto LAB_00223183;
  case copy:
    if (local_88 == (_func_void_ptr_void_ptr *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)&local_a8);
      clean_type_id(&local_80);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"return_value_policy = copy, but type ",&local_80);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_a8 = (char *)*plVar10;
      plVar12 = plVar10 + 2;
      if ((long *)local_a8 == plVar12) {
        local_a0._8_8_ = *plVar12;
        lStack_90 = plVar10[3];
        local_a8 = local_a0._M_local_buf + 8;
      }
      else {
        local_a0._8_8_ = *plVar12;
      }
      local_a0._M_allocated_capacity = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(prVar9,(string *)&local_a8);
      *(undefined ***)prVar9 = &PTR__runtime_error_00574c60;
      __cxa_throw(prVar9,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = (*local_88)(local_b8);
    break;
  case move:
    p_Var11 = local_58;
    if ((local_58 == (_func_void_ptr_void_ptr *)0x0) &&
       (p_Var11 = local_88, local_88 == (_func_void_ptr_void_ptr *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 *(char **)(tinfo->cpptype + 8) + (**(char **)(tinfo->cpptype + 8) == '*'),
                 (allocator<char> *)&local_a8);
      clean_type_id(&local_80);
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"return_value_policy = move, but type ",&local_80);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_a8 = (char *)*plVar10;
      plVar12 = plVar10 + 2;
      if ((long *)local_a8 == plVar12) {
        local_a0._8_8_ = *plVar12;
        lStack_90 = plVar10[3];
        local_a8 = local_a0._M_local_buf + 8;
      }
      else {
        local_a0._8_8_ = *plVar12;
      }
      local_a0._M_allocated_capacity = plVar10[1];
      *plVar10 = (long)plVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(prVar9,(string *)&local_a8);
      *(undefined ***)prVar9 = &PTR__runtime_error_00574c60;
      __cxa_throw(prVar9,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = (*p_Var11)(local_b8);
    break;
  case reference_internal:
    paVar15->simple_value_holder[0] = local_b8;
    this->field_0x30 = this->field_0x30 & 0xfe;
    keep_alive_impl((handle)local_b0,local_60);
    goto LAB_00223187;
  default:
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"unhandled return_value_policy: should not happen!");
    *(undefined ***)prVar9 = &PTR__runtime_error_00574c60;
    __cxa_throw(prVar9,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar15->simple_value_holder[0] = pvVar8;
  bVar3 = this->field_0x30 | 1;
LAB_00223183:
  this->field_0x30 = bVar3;
LAB_00223187:
  (*tinfo->init_instance)(this,existing_holder);
  this_00 = (string *)local_b0;
  auVar13 = local_b0;
LAB_0022319d:
  (this_00->_M_dataplus)._M_p = (pointer)0x0;
  object::~object((object *)this_00);
  return (handle)(PyObject *)auVar13;
}

Assistant:

PYBIND11_NOINLINE static handle cast(const void *_src, return_value_policy policy, handle parent,
                                         const detail::type_info *tinfo,
                                         void *(*copy_constructor)(const void *),
                                         void *(*move_constructor)(const void *),
                                         const void *existing_holder = nullptr) {
        if (!tinfo) // no type info: error will be set already
            return handle();

        void *src = const_cast<void *>(_src);
        if (src == nullptr)
            return none().release();

        auto it_instances = get_internals().registered_instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype))
                    return handle((PyObject *) it_i->second).inc_ref();
            }
        }

        auto inst = reinterpret_steal<object>(make_new_instance(tinfo->type));
        auto wrapper = reinterpret_cast<instance *>(inst.ptr());
        wrapper->owned = false;
        void *&valueptr = values_and_holders(wrapper).begin()->value_ptr();

        switch (policy) {
            case return_value_policy::automatic:
            case return_value_policy::take_ownership:
                valueptr = src;
                wrapper->owned = true;
                break;

            case return_value_policy::automatic_reference:
            case return_value_policy::reference:
                valueptr = src;
                wrapper->owned = false;
                break;

            case return_value_policy::copy:
                if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = copy, but type is "
                                     "non-copyable! (compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = copy, but type " +
                                     type_name + " is non-copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::move:
                if (move_constructor)
                    valueptr = move_constructor(src);
                else if (copy_constructor)
                    valueptr = copy_constructor(src);
                else {
#if defined(NDEBUG)
                    throw cast_error("return_value_policy = move, but type is neither "
                                     "movable nor copyable! "
                                     "(compile in debug mode for details)");
#else
                    std::string type_name(tinfo->cpptype->name());
                    detail::clean_type_id(type_name);
                    throw cast_error("return_value_policy = move, but type " +
                                     type_name + " is neither movable nor copyable!");
#endif
                }
                wrapper->owned = true;
                break;

            case return_value_policy::reference_internal:
                valueptr = src;
                wrapper->owned = false;
                keep_alive_impl(inst, parent);
                break;

            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        }

        tinfo->init_instance(wrapper, existing_holder);

        return inst.release();
    }